

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

uint8_t mipsdsp_rnd8_rashift(uint8_t a,uint8_t s)

{
  int iVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,s) == 0) {
    iVar1 = (uint)a * 2;
  }
  else {
    iVar1 = (int)(char)a >> (s - 1 & 0x1f);
  }
  return (uint8_t)(iVar1 + 1U >> 1);
}

Assistant:

static inline uint8_t mipsdsp_rnd8_rashift(uint8_t a, uint8_t s)
{
    uint32_t temp;

    if (s == 0) {
        temp = (uint32_t)a << 1;
    } else {
        temp = (int32_t)(int8_t)a >> (s - 1);
    }

    return (temp + 1) >> 1;
}